

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O1

void __thiscall helics::tcp::TcpComms::setFlag(TcpComms *this,string_view flag,bool val)

{
  bool bVar1;
  int iVar2;
  size_type __rlen;
  
  if (flag._M_len == 9) {
    iVar2 = bcmp(flag._M_str,"encrypted",9);
    if (iVar2 == 0) {
      bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
      if (!bVar1) {
        return;
      }
      (this->super_NetworkCommsInterface).encrypted = val;
LAB_002bfef8:
      CommsInterface::propertyUnLock((CommsInterface *)this);
      return;
    }
  }
  else if ((flag._M_len == 0xd) && (iVar2 = bcmp(flag._M_str,"reuse_address",0xd), iVar2 == 0)) {
    bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
    if (!bVar1) {
      return;
    }
    this->reuse_address = val;
    goto LAB_002bfef8;
  }
  NetworkCommsInterface::setFlag(&this->super_NetworkCommsInterface,flag,val);
  return;
}

Assistant:

void TcpComms::setFlag(std::string_view flag, bool val)
{
    if (flag == "reuse_address") {
        if (propertyLock()) {
            reuse_address = val;
            propertyUnLock();
        }
    } else if (flag == "encrypted") {
        if (propertyLock()) {
            encrypted = val;
            propertyUnLock();
        }
    } else {
        NetworkCommsInterface::setFlag(flag, val);
    }
}